

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestPackage.cpp
# Opt level: O0

void __thiscall
tcu::TestPackageRoot::TestPackageRoot
          (TestPackageRoot *this,TestContext *testCtx,TestPackageRegistry *packageRegistry)

{
  vector<tcu::TestPackageRegistry::PackageInfo_*,_std::allocator<tcu::TestPackageRegistry::PackageInfo_*>_>
  *this_00;
  size_type sVar1;
  const_reference ppPVar2;
  TestNode *node;
  int local_2c;
  int i;
  vector<tcu::TestPackageRegistry::PackageInfo_*,_std::allocator<tcu::TestPackageRegistry::PackageInfo_*>_>
  *packageInfos;
  TestPackageRegistry *packageRegistry_local;
  TestContext *testCtx_local;
  TestPackageRoot *this_local;
  
  TestNode::TestNode(&this->super_TestNode,testCtx,NODETYPE_ROOT,"","");
  (this->super_TestNode)._vptr_TestNode = (_func_int **)&PTR__TestPackageRoot_0067b968;
  this_00 = TestPackageRegistry::getPackageInfos(packageRegistry);
  local_2c = 0;
  while( true ) {
    sVar1 = std::
            vector<tcu::TestPackageRegistry::PackageInfo_*,_std::allocator<tcu::TestPackageRegistry::PackageInfo_*>_>
            ::size(this_00);
    if ((int)sVar1 <= local_2c) break;
    ppPVar2 = std::
              vector<tcu::TestPackageRegistry::PackageInfo_*,_std::allocator<tcu::TestPackageRegistry::PackageInfo_*>_>
              ::operator[](this_00,(long)local_2c);
    node = &(*(*ppPVar2)->createFunc)(testCtx)->super_TestNode;
    TestNode::addChild(&this->super_TestNode,node);
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

TestPackageRoot::TestPackageRoot (TestContext& testCtx, const TestPackageRegistry* packageRegistry)
	: TestNode(testCtx, NODETYPE_ROOT, "", "")
{
	const vector<TestPackageRegistry::PackageInfo*>&	packageInfos	= packageRegistry->getPackageInfos();

	for (int i = 0; i < (int)packageInfos.size(); i++)
		addChild(packageInfos[i]->createFunc(testCtx));
}